

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O0

void __thiscall DataRefs::ForceDataReload(DataRefs *this)

{
  bool bVar1;
  int iVar2;
  int *in_RDI;
  undefined1 uVar3;
  bool bShowAc;
  int in_stack_ffffffffffffffec;
  undefined7 in_stack_fffffffffffffff0;
  
  if (1 < *in_RDI) {
    iVar2 = AreAircraftDisplayed(&dataRefs);
    uVar3 = iVar2 != 0;
    SetAircraftDisplayed
              ((DataRefs *)CONCAT17(uVar3,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
    LTMainDisable();
    bVar1 = LTMainEnable();
    if (bVar1) {
      SetAircraftDisplayed
                ((DataRefs *)CONCAT17(uVar3,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
    }
  }
  return;
}

Assistant:

void DataRefs::ForceDataReload ()
{
    // if we change this setting while running
    // we 'simulate' a re-initialization
    if (pluginState >= STATE_ENABLED) {
        // remove all existing aircraft
        bool bShowAc = dataRefs.AreAircraftDisplayed();
        dataRefs.SetAircraftDisplayed(false);

        // disable myself / stop all connections
        LTMainDisable();
        
        // create the connections to flight data
        if ( LTMainEnable() ) {
            // display aircraft (if that was the case previously)
            dataRefs.SetAircraftDisplayed(bShowAc);
        }
    }
}